

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O1

int XUtf8UcsWidth(XUtf8FontStruct *font_set,uint ucs)

{
  unsigned_short uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uint ucs_00;
  ulong uVar7;
  long lVar8;
  int *piVar9;
  XFontStruct **ppXVar10;
  bool bVar11;
  char glyph [2];
  XChar2b buf [8];
  undefined2 local_72;
  int *local_70;
  ulong local_68;
  int *local_60;
  XFontStruct **local_58;
  int *local_50;
  undefined2 local_48 [12];
  
  iVar3 = font_set->nb_font;
  uVar7 = (ulong)iVar3;
  if ((long)uVar7 < 1) {
LAB_001fdc68:
    iVar2 = 0;
  }
  else {
    local_70 = font_set->ranges;
    piVar9 = font_set->encodings;
    ppXVar10 = font_set->fonts;
    iVar2 = 0;
    if (*ppXVar10 == (XFontStruct *)0x0) {
      uVar4 = 0;
      do {
        if (uVar7 - 1 == uVar4) goto LAB_001fdc68;
        uVar6 = uVar4 + 1;
        lVar8 = uVar4 + 1;
        uVar4 = uVar6;
      } while (ppXVar10[lVar8] == (XFontStruct *)0x0);
      bVar11 = uVar6 < uVar7;
    }
    else {
      bVar11 = true;
      uVar6 = 0;
    }
    if (bVar11) {
      uVar1 = XUtf8IsNonSpacing(ucs);
      ucs_00 = (uint)uVar1;
      if (uVar1 == 0) {
        ucs_00 = ucs;
      }
      iVar5 = (int)uVar6;
      iVar2 = iVar5;
      if (iVar5 < iVar3) {
        local_50 = piVar9 + uVar6;
        local_70 = local_70 + uVar6 * 2 + 1;
        lVar8 = 0;
        local_68 = uVar7;
        local_60 = piVar9;
        local_58 = ppXVar10;
        do {
          if (ppXVar10[uVar6 + lVar8] != (XFontStruct *)0x0) {
            iVar3 = local_50[lVar8];
            iVar2 = ucs2fontmap((char *)&local_72,ucs_00,iVar3);
            if ((-1 < iVar2) &&
               ((iVar3 != 0 ||
                ((local_70[lVar8 * 2 + -1] <= (int)ucs_00 && ((int)ucs_00 <= local_70[lVar8 * 2]))))
               )) {
              iVar2 = (int)lVar8 + iVar5;
              iVar3 = (int)local_68;
              piVar9 = local_60;
              ppXVar10 = local_58;
              goto LAB_001fdc7e;
            }
          }
          lVar8 = lVar8 + 1;
        } while ((uVar6 - uVar7) + lVar8 != 0);
        iVar3 = (int)local_68;
        piVar9 = local_60;
        ppXVar10 = local_58;
        iVar2 = iVar3;
      }
LAB_001fdc7e:
      if (iVar2 == iVar3) {
        ucs2fontmap((char *)&local_72,0x3f,piVar9[uVar6 & 0xffffffff]);
        iVar2 = iVar5;
      }
      local_48[0] = local_72;
      iVar2 = XTextWidth16(ppXVar10[iVar2],local_48,1);
    }
  }
  return iVar2;
}

Assistant:

int
XUtf8UcsWidth(XUtf8FontStruct  *font_set,
	      unsigned int     ucs) {

  int		x;
  int 		*encodings; /* encodings array */
  XFontStruct 	**fonts;    /* fonts array */
  Fl_XChar2b 	buf[8];     /* drawing buffer */
  int 		fnum;       /* index of the current font in the fonts array*/
  int 		first;      /* first valid font index */
  int 		nb_font;    /* quantity of fonts in the font array */
  char 		glyph[2];   /* byte1 and byte2 value of the UTF-8 char */
  int		*ranges;    /* sub range of iso10646 */
  unsigned int  no_spc;

  nb_font = font_set->nb_font;
  x = 0;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return x;
  }

  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  fnum = 0;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return x;
  }

  first = fnum;

  no_spc = XUtf8IsNonSpacing(ucs);
  if (no_spc) ucs = no_spc;

  /*
   * find the first encoding which can be used to
   * draw the glyph
   */
  fnum = first;
  while (fnum < nb_font) {
    if (fonts[fnum] &&
	ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
      if (encodings[fnum] != 0 || ((int)ucs >= ranges[fnum * 2] &&
	  (int)ucs <= ranges[fnum * 2 + 1])) {
	break;
      }
    }
    fnum++;
  }
  if (fnum == nb_font) {
    /* the char is not valid in all encodings ->
     * draw it using the first font :-(
     */
    fnum = first;
    ucs2fontmap(glyph, '?', encodings[fnum]);
  }

  (*buf).byte1 = glyph[0];
  (*buf).byte2 = glyph[1];

  x += XTextWidth16(fonts[fnum], buf, 1);

  return x;
}